

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O2

void h2v1_merged_upsample
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  uint uVar1;
  int iVar2;
  jpeg_upsampler *pjVar3;
  JSAMPLE *pJVar4;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var5;
  long lVar6;
  _func_void_j_decompress_ptr *p_Var7;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var8;
  JSAMPROW pJVar9;
  JSAMPROW pJVar10;
  JSAMPROW pJVar11;
  long lVar12;
  JSAMPROW pJVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  
  pjVar3 = cinfo->upsample;
  pJVar4 = cinfo->sample_range_limit;
  p_Var5 = pjVar3[1].upsample;
  lVar6 = *(long *)&pjVar3[1].need_context_rows;
  p_Var7 = pjVar3[2].start_pass;
  p_Var8 = pjVar3[2].upsample;
  pJVar9 = (*input_buf)[in_row_group_ctr];
  pJVar10 = input_buf[1][in_row_group_ctr];
  pJVar11 = input_buf[2][in_row_group_ctr];
  pJVar13 = *output_buf;
  uVar1 = cinfo->output_width;
  for (lVar16 = 0; uVar1 >> 1 != (uint)lVar16; lVar16 = lVar16 + 1) {
    uVar14 = (ulong)pJVar10[lVar16];
    uVar18 = (ulong)pJVar11[lVar16];
    lVar15 = (long)*(int *)(p_Var5 + uVar18 * 4);
    lVar17 = *(long *)(p_Var7 + uVar18 * 8);
    lVar12 = *(long *)(p_Var8 + uVar14 * 8);
    lVar19 = (long)*(int *)(lVar6 + uVar14 * 4);
    uVar14 = (ulong)pJVar9[lVar16 * 2];
    *pJVar13 = pJVar4[uVar14 + lVar15];
    lVar17 = (long)(int)((ulong)(lVar17 + lVar12) >> 0x10);
    pJVar13[1] = pJVar4[uVar14 + lVar17];
    pJVar13[2] = pJVar4[uVar14 + lVar19];
    uVar14 = (ulong)pJVar9[lVar16 * 2 + 1];
    pJVar13[3] = pJVar4[lVar15 + uVar14];
    pJVar13[4] = pJVar4[lVar17 + uVar14];
    pJVar13[5] = pJVar4[lVar19 + uVar14];
    pJVar13 = pJVar13 + 6;
  }
  if ((cinfo->output_width & 1) != 0) {
    uVar14 = (ulong)pJVar10[lVar16];
    uVar18 = (ulong)pJVar11[lVar16];
    lVar17 = *(long *)(p_Var7 + uVar18 * 8);
    lVar12 = *(long *)(p_Var8 + uVar14 * 8);
    iVar2 = *(int *)(lVar6 + uVar14 * 4);
    uVar14 = (ulong)pJVar9[lVar16 * 2];
    *pJVar13 = pJVar4[(long)*(int *)(p_Var5 + uVar18 * 4) + uVar14];
    pJVar13[1] = pJVar4[(long)(int)((ulong)(lVar17 + lVar12) >> 0x10) + uVar14];
    pJVar13[2] = pJVar4[(long)iVar2 + uVar14];
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_merged_upsample (j_decompress_ptr cinfo,
		      JSAMPIMAGE input_buf, JDIMENSION in_row_group_ctr,
		      JSAMPARRAY output_buf)
{
  my_upsample_ptr upsample = (my_upsample_ptr) cinfo->upsample;
  register int y, cred, cgreen, cblue;
  int cb, cr;
  register JSAMPROW outptr;
  JSAMPROW inptr0, inptr1, inptr2;
  JDIMENSION col;
  /* copy these pointers into registers if possible */
  register JSAMPLE * range_limit = cinfo->sample_range_limit;
  int * Crrtab = upsample->Cr_r_tab;
  int * Cbbtab = upsample->Cb_b_tab;
  INT32 * Crgtab = upsample->Cr_g_tab;
  INT32 * Cbgtab = upsample->Cb_g_tab;
  SHIFT_TEMPS

  inptr0 = input_buf[0][in_row_group_ctr];
  inptr1 = input_buf[1][in_row_group_ctr];
  inptr2 = input_buf[2][in_row_group_ctr];
  outptr = output_buf[0];
  /* Loop for each pair of output pixels */
  for (col = cinfo->output_width >> 1; col > 0; col--) {
    /* Do the chroma part of the calculation */
    cb = GETJSAMPLE(*inptr1++);
    cr = GETJSAMPLE(*inptr2++);
    cred = Crrtab[cr];
    cgreen = (int) RIGHT_SHIFT(Cbgtab[cb] + Crgtab[cr], SCALEBITS);
    cblue = Cbbtab[cb];
    /* Fetch 2 Y values and emit 2 pixels */
    y  = GETJSAMPLE(*inptr0++);
    outptr[RGB_RED] =   range_limit[y + cred];
    outptr[RGB_GREEN] = range_limit[y + cgreen];
    outptr[RGB_BLUE] =  range_limit[y + cblue];
    outptr += RGB_PIXELSIZE;
    y  = GETJSAMPLE(*inptr0++);
    outptr[RGB_RED] =   range_limit[y + cred];
    outptr[RGB_GREEN] = range_limit[y + cgreen];
    outptr[RGB_BLUE] =  range_limit[y + cblue];
    outptr += RGB_PIXELSIZE;
  }
  /* If image width is odd, do the last output column separately */
  if (cinfo->output_width & 1) {
    cb = GETJSAMPLE(*inptr1);
    cr = GETJSAMPLE(*inptr2);
    cred = Crrtab[cr];
    cgreen = (int) RIGHT_SHIFT(Cbgtab[cb] + Crgtab[cr], SCALEBITS);
    cblue = Cbbtab[cb];
    y  = GETJSAMPLE(*inptr0);
    outptr[RGB_RED] =   range_limit[y + cred];
    outptr[RGB_GREEN] = range_limit[y + cgreen];
    outptr[RGB_BLUE] =  range_limit[y + cblue];
  }
}